

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O2

bool __thiscall Matrix::CopyRow(Matrix *this,int source_row,int destination_row)

{
  pointer pvVar1;
  bool bVar2;
  bool bVar3;
  int column;
  long lVar4;
  long lVar5;
  
  if (source_row == destination_row) {
    bVar3 = false;
  }
  else {
    lVar5 = 0;
    bVar3 = false;
    for (lVar4 = 0; lVar4 < this->m_; lVar4 = lVar4 + 1) {
      pvVar1 = (this->elements_).
               super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      bVar2 = operator!=((Fraction *)
                         (*(long *)&pvVar1[destination_row].
                                    super__Vector_base<Fraction,_std::allocator<Fraction>_>._M_impl.
                                    super__Vector_impl_data + lVar5),
                         (Fraction *)
                         (*(long *)&pvVar1[source_row].
                                    super__Vector_base<Fraction,_std::allocator<Fraction>_>._M_impl.
                                    super__Vector_impl_data + lVar5));
      if (bVar2) {
        pvVar1 = (this->elements_).
                 super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(undefined8 *)
         (*(long *)&pvVar1[destination_row].super__Vector_base<Fraction,_std::allocator<Fraction>_>.
                    _M_impl.super__Vector_impl_data + lVar5) =
             *(undefined8 *)
              (*(long *)&pvVar1[source_row].super__Vector_base<Fraction,_std::allocator<Fraction>_>.
                         _M_impl.super__Vector_impl_data + lVar5);
        bVar3 = true;
      }
      lVar5 = lVar5 + 8;
    }
  }
  return bVar3;
}

Assistant:

bool Matrix::CopyRow(int source_row, int destination_row) {
  if (source_row == destination_row) {
    return false;
  }

  bool result = false;
  for (int column = 0; column < m_; ++column) {
    if (elements_[destination_row][column] != elements_[source_row][column]) {
      result = true;
      elements_[destination_row][column] = elements_[source_row][column];
    }
  }

  return result;
}